

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmmath.c
# Opt level: O0

double lj_vm_foldfpm(double x,int fpm)

{
  int fpm_local;
  double x_local;
  
  switch(fpm) {
  case 0:
    x_local = (double)lj_vm_floor(x);
    break;
  case 1:
    x_local = (double)lj_vm_ceil(x);
    break;
  case 2:
    x_local = (double)lj_vm_trunc(x);
    break;
  case 3:
    x_local = sqrt(x);
    break;
  case 4:
    x_local = log(x);
    break;
  case 5:
    x_local = log2(x);
    break;
  default:
    x_local = 0.0;
  }
  return x_local;
}

Assistant:

double lj_vm_foldfpm(double x, int fpm)
{
  switch (fpm) {
  case IRFPM_FLOOR: return lj_vm_floor(x);
  case IRFPM_CEIL: return lj_vm_ceil(x);
  case IRFPM_TRUNC: return lj_vm_trunc(x);
  case IRFPM_SQRT: return sqrt(x);
  case IRFPM_LOG: return log(x);
  case IRFPM_LOG2: return lj_vm_log2(x);
  default: lj_assertX(0, "bad fpm %d", fpm);
  }
  return 0;
}